

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::SetObjectBeforeCollectCallback
          (Recycler *this,void *object,ObjectBeforeCollectCallback callback,void *callbackState,
          ObjectBeforeCollectCallbackWrapper callbackWrapper,void *threadContext)

{
  bool bVar1;
  Type *pTVar2;
  ObjectBeforeCollectCallbackList *this_00;
  undefined1 local_70 [8];
  EditingIterator iter;
  void *local_48;
  void *object_local;
  ArenaAllocator *local_38;
  
  if (this->objectBeforeCollectCallbackState != ObjectBeforeCollectCallback_Shutdown) {
    this_00 = this->objectBeforeCollectCallbackList;
    local_48 = object;
    if (this_00 == (ObjectBeforeCollectCallbackList *)0x0) {
      if (callback == (ObjectBeforeCollectCallback)0x0) {
        return;
      }
      local_38 = &this->objectBeforeCollectCallbackArena;
      object_local = callbackWrapper;
      this_00 = (ObjectBeforeCollectCallbackList *)
                new<Memory::ArenaAllocator>(0x18,local_38,0x1e925c);
      (this_00->
      super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
      ).super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)this_00;
      (this_00->
      super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
      ).super_RealCount.count = 0;
      this_00->allocator = local_38;
      this->objectBeforeCollectCallbackList = this_00;
    }
    else if (callback == (ObjectBeforeCollectCallback)0x0) {
      iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
      local_70 = (undefined1  [8])this_00;
      iter.super_EditingIterator.super_Iterator.list =
           &this_00->
            super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
      ;
      while (bVar1 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                     ::EditingIterator::Next((EditingIterator *)local_70), bVar1) {
        pTVar2 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                 ::Iterator::Data((Iterator *)local_70);
        if (pTVar2->object == object) {
          SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
          ::EditingIterator::RemoveCurrent((EditingIterator *)local_70);
        }
      }
      return;
    }
    local_70 = (undefined1  [8])object;
    iter.super_EditingIterator.super_Iterator.list =
         (SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
          *)callback;
    iter.super_EditingIterator.super_Iterator.current = (NodeBase *)callbackState;
    iter.super_EditingIterator.last = (NodeBase *)threadContext;
    SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>::
    Prepend(this_00,(ObjectBeforeCollectCallbackData *)local_70);
    if (this->objectBeforeCollectCallbackState != ObjectBeforeCollectCallback_None) {
      ScanMemoryInline<false,false>(this,&local_48,8);
      ProcessMark(this,false);
    }
  }
  return;
}

Assistant:

void Recycler::SetObjectBeforeCollectCallback(void* object,
    ObjectBeforeCollectCallback callback,
    void* callbackState,
    ObjectBeforeCollectCallbackWrapper callbackWrapper,
    void* threadContext)
{
    if (objectBeforeCollectCallbackState == ObjectBeforeCollectCallback_Shutdown)
    {
        return; // NOP at shutdown
    }

    if (this->objectBeforeCollectCallbackList == nullptr)
    {
        if (callback == nullptr) return;
        this->objectBeforeCollectCallbackList = Anew(&this->objectBeforeCollectCallbackArena, ObjectBeforeCollectCallbackList, &this->objectBeforeCollectCallbackArena);
    }

    if (callback)
    {
        this->objectBeforeCollectCallbackList->Push(ObjectBeforeCollectCallbackData(object, callbackWrapper, callback, callbackState, threadContext));

        if (this->IsInObjectBeforeCollectCallback()) // revive
        {
            this->ScanMemory<false>(&object, sizeof(object));
            this->ProcessMark(/*background*/false);
        }
    }
    else
    {
        // null callback means unregister
        FOREACH_SLIST_ENTRY_EDITING(ObjectBeforeCollectCallbackData, callbackData, this->objectBeforeCollectCallbackList, iter)
        {
            if (callbackData.object == object)
            {
                iter.RemoveCurrent();
            }
        } NEXT_SLIST_ENTRY_EDITING;
    }

}